

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.cpp
# Opt level: O2

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  byte bVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  uint uVar4;
  size_t __maxlen;
  int iVar5;
  bool bVar6;
  
  if (size < 0x80000000) {
    uVar2 = oid->len;
    iVar5 = -0x60;
    if (uVar2 != 0) {
      uVar4 = 0;
      __maxlen = size;
      for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
        if ((0x1ffffff < uVar4) || (bVar1 = oid->p[uVar3], uVar4 == 0 && bVar1 == 0x80)) {
          return -0x68;
        }
        uVar4 = bVar1 & 0x7f | uVar4 << 7;
        if (-1 < (char)bVar1) {
          if (size == __maxlen) {
            if (uVar4 < 0x50) {
              uVar2 = (ulong)(0x31 - (uVar4 < 0x28));
            }
            else {
              uVar2 = 0x32;
            }
            uVar4 = snprintf(buf,size,"%c.%u",uVar2);
          }
          else {
            uVar4 = snprintf(buf,__maxlen,".%u",(ulong)uVar4);
          }
          if ((int)uVar4 < 2) {
            return -0xb;
          }
          uVar2 = (ulong)uVar4;
          bVar6 = __maxlen < uVar2;
          __maxlen = __maxlen - uVar2;
          if (bVar6 || __maxlen == 0) {
            return -0xb;
          }
          buf = buf + uVar2;
          uVar2 = oid->len;
          uVar4 = 0;
        }
      }
      if (uVar4 == 0) {
        iVar5 = (int)size - (int)__maxlen;
      }
    }
  }
  else {
    iVar5 = -100;
  }
  return iVar5;
}

Assistant:

int mbedtls_oid_get_numeric_string(char *buf, size_t size,
                                   const mbedtls_asn1_buf *oid)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    char *p = buf;
    size_t n = size;
    unsigned int value = 0;

    if (size > INT_MAX) {
        /* Avoid overflow computing return value */
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    if (oid->len <= 0) {
        /* OID must not be empty */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    for (size_t i = 0; i < oid->len; i++) {
        /* Prevent overflow in value. */
        if (value > (UINT_MAX >> 7)) {
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }
        if ((value == 0) && ((oid->p[i]) == 0x80)) {
            /* Overlong encoding is not allowed */
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }

        value <<= 7;
        value |= oid->p[i] & 0x7F;

        if (!(oid->p[i] & 0x80)) {
            /* Last byte */
            if (n == size) {
                int component1;
                unsigned int component2;
                /* First subidentifier contains first two OID components */
                if (value >= 80) {
                    component1 = '2';
                    component2 = value - 80;
                } else if (value >= 40) {
                    component1 = '1';
                    component2 = value - 40;
                } else {
                    component1 = '0';
                    component2 = value;
                }
                ret = mbedtls_snprintf(p, n, "%c.%u", component1, component2);
            } else {
                ret = mbedtls_snprintf(p, n, ".%u", value);
            }
            if (ret < 2 || (size_t) ret >= n) {
                return MBEDTLS_ERR_OID_BUF_TOO_SMALL;
            }
            n -= (size_t) ret;
            p += ret;
            value = 0;
        }
    }

    if (value != 0) {
        /* Unterminated subidentifier */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    return (int) (size - n);
}